

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

Pubkey * __thiscall
cfd::core::Privkey::GeneratePubkey(Pubkey *__return_storage_ptr__,Privkey *this,bool is_compressed)

{
  int iVar1;
  size_t priv_key_len;
  CfdException *pCVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  int ret;
  string local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressed_pubkey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  CfdSourceLocation local_80;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&pubkey,0x21,(allocator_type *)&local_d0);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d0,&this->data_
                    );
  priv_key_len = ByteData::GetDataSize(&this->data_);
  iVar1 = wally_ec_public_key_from_private_key
                    ((uchar *)local_d0._M_dataplus._M_p,priv_key_len,
                     pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d0);
  ret = iVar1;
  if (iVar1 != 0) {
    uncompressed_pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcore_key.cpp";
    uncompressed_pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x332;
    uncompressed_pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "GeneratePubkey";
    ByteData::GetHex_abi_cxx11_(&local_d0,&this->data_);
    logger::warn<int&,std::__cxx11::string>
              ((CfdSourceLocation *)&uncompressed_pubkey,
               "wally_ec_public_key_from_private_key error. ret={} privkey={}.",&ret,&local_d0);
    ::std::__cxx11::string::~string((string *)&local_d0);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&local_d0,"Generate Pubkey error.",(allocator *)&uncompressed_pubkey);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_d0);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (is_compressed) {
    ByteData::ByteData((ByteData *)&local_38,&pubkey);
    Pubkey::Pubkey(__return_storage_ptr__,(ByteData *)&local_38);
    this_00 = &local_38;
  }
  else {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&uncompressed_pubkey,0x41,(allocator_type *)&local_d0);
    ret = wally_ec_public_key_decompress
                    (pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                     uncompressed_pubkey.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     CONCAT44(uncompressed_pubkey.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish._4_4_,
                              uncompressed_pubkey.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish._0_4_) -
                     (long)uncompressed_pubkey.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
    if (ret != 0) {
      local_80.filename = "cfdcore_key.cpp";
      local_80.line = 0x342;
      local_80.funcname = "GeneratePubkey";
      ByteData::ByteData((ByteData *)&local_50,&pubkey);
      ByteData::GetHex_abi_cxx11_(&local_d0,(ByteData *)&local_50);
      logger::warn<int&,std::__cxx11::string>
                (&local_80,"wally_ec_public_key_decompress error. ret={} compressed pubkey={}.",&ret
                 ,&local_d0);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&local_d0,"Decompressed Pubkey error.",(allocator *)&local_80);
      CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_d0);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData((ByteData *)&local_68,&uncompressed_pubkey);
    Pubkey::Pubkey(__return_storage_ptr__,(ByteData *)&local_68);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
    this_00 = &uncompressed_pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ;
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this_00);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

Pubkey Privkey::GeneratePubkey(bool is_compressed) const {
  std::vector<uint8_t> pubkey(Pubkey::kCompressedPubkeySize);
  int ret = wally_ec_public_key_from_private_key(
      data_.GetBytes().data(), data_.GetDataSize(), pubkey.data(),
      pubkey.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE,
        "wally_ec_public_key_from_private_key error. ret={} privkey={}.", ret,
        data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Generate Pubkey error.");
  }
  if (is_compressed) {
    return Pubkey(pubkey);
  }

  std::vector<uint8_t> uncompressed_pubkey(Pubkey::kPubkeySize);
  ret = wally_ec_public_key_decompress(
      pubkey.data(), pubkey.size(), uncompressed_pubkey.data(),
      uncompressed_pubkey.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE,
        "wally_ec_public_key_decompress error. ret={} compressed pubkey={}.",
        ret, ByteData(pubkey).GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Decompressed Pubkey error.");
  }
  return Pubkey(uncompressed_pubkey);
}